

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int cmp(void *param_1,void *param_2)

{
  int local_14;
  int local_10;
  int i;
  int sumy;
  int sumx;
  
  i = 0;
  local_10 = 0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    i = *(int *)(&stack0x00000018 + (long)local_14 * 4) + i;
    local_10 = *(int *)(&stack0x00000038 + (long)local_14 * 4) + local_10;
  }
  return CONCAT31((int3)((uint)i >> 8),local_10 < i);
}

Assistant:

bool cmp(Student x ,Student y)
{
    int sumx = 0;
    int sumy = 0;
    for (int i = 0; i < 4; ++i) {
        sumx += x.socre[i];
        sumy += y.socre[i];
    }
    return sumx > sumy;
}